

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_gemm.hpp
# Opt level: O1

void remora::bindings::
     dense_gemm<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double_const,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>,remora::dense_matrix_adaptor<double,remora::row_major,remora::continuous_dense_tag,remora::cpu_tag>>
               (matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::column_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                *e1,matrix_expression<remora::dense_matrix_adaptor<const_double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                    *e2,matrix_expression<remora::dense_matrix_adaptor<double,_remora::row_major,_remora::continuous_dense_tag,_remora::cpu_tag>,_remora::cpu_tag>
                        *m,value_type alpha)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  pointer __ptr;
  pointer __ptr_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t stride1;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  aligned_allocator<double,_64UL> allocator;
  long local_118;
  type As;
  type Bs;
  
  __ptr = boost::alignment::aligned_allocator<double,_64UL>::allocate
                    (&allocator,0x10000,(const_void_pointer)0x0);
  __ptr_00 = boost::alignment::aligned_allocator<double,_64UL>::allocate
                       (&allocator,0x7f800,(const_void_pointer)0x0);
  lVar2 = *(long *)(m + 0x10);
  uVar1 = lVar2 + 0x3fb;
  if (0x3fb < uVar1) {
    local_118 = *(long *)m;
    uVar3 = *(ulong *)(m + 8);
    lVar4 = *(long *)(e1 + 0x10);
    uVar10 = uVar3 + 0x7f;
    uVar6 = lVar4 + 0x1ff;
    lVar5 = *(long *)(m + 0x18);
    uVar9 = 0;
    do {
      uVar12 = lVar2 + uVar9 * -0x3fc;
      if (0x3fb < uVar12) {
        uVar12 = 0x3fc;
      }
      if (0x1ff < uVar6) {
        lVar11 = 0;
        uVar8 = 0;
        do {
          uVar13 = lVar4 + uVar8 * -0x200;
          if (0x1ff < uVar13) {
            uVar13 = 0x200;
          }
          Bs.m_leading_dimension = *(size_type *)(e2 + 0x18);
          Bs.m_values = (double *)
                        (uVar8 * 0x200 * Bs.m_leading_dimension * 8 + *(long *)e2 + uVar9 * 0x1fe0);
          Bs.m_size1 = uVar13;
          Bs.m_size2 = uVar12;
          pack_B_dense<remora::dense_matrix_adaptor<double_const,remora::row_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::gemm_block_size<double>>
                    (&Bs,__ptr_00);
          if (0x7f < uVar10) {
            lVar17 = 0;
            uVar7 = uVar10 >> 7;
            lVar15 = local_118;
            uVar16 = uVar3;
            do {
              uVar14 = 0x80;
              if (uVar16 < 0x80) {
                uVar14 = uVar16;
              }
              As.m_leading_dimension = *(size_type *)(e1 + 0x18);
              As.m_values = (double *)(lVar11 * As.m_leading_dimension + *(long *)e1 + lVar17);
              As.m_size1 = uVar14;
              As.m_size2 = uVar13;
              pack_A_dense<remora::dense_matrix_adaptor<double_const,remora::column_major,remora::dense_tag,remora::cpu_tag>,double,remora::bindings::gemm_block_size<double>>
                        (&As,__ptr);
              mgemm<double,double,remora::bindings::gemm_block_size<double>>
                        (alpha,uVar14,uVar12,uVar13,__ptr,__ptr_00,lVar15,lVar5,1);
              lVar17 = lVar17 + 0x400;
              uVar16 = uVar16 - 0x80;
              lVar15 = lVar15 + lVar5 * 0x400;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          uVar8 = uVar8 + 1;
          lVar11 = lVar11 + 0x1000;
        } while (uVar8 != uVar6 >> 9);
      }
      uVar9 = uVar9 + 1;
      local_118 = local_118 + 0x1fe0;
    } while (uVar9 != uVar1 / 0x3fc);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void dense_gemm(
	matrix_expression<E1, cpu_tag> const& e1,
	matrix_expression<E2, cpu_tag> const& e2,
	matrix_expression<Mat, cpu_tag>& m,
	typename Mat::value_type alpha
){
	static_assert(std::is_same<typename Mat::orientation,row_major>::value,"target matrix must be row major");
	typedef typename std::common_type<
		typename E1::value_type, typename E2::value_type, typename Mat::value_type
	>::type value_type;

	typedef gemm_block_size<
		typename std::common_type<typename E1::value_type, typename E2::value_type>::type
	> block_size;

	static const std::size_t MC = block_size::mc;
	static const std::size_t NC = block_size::nc;
	static const std::size_t KC = block_size::kc;

	//obtain uninitialized aligned storage
	boost::alignment::aligned_allocator<value_type,block_size::block::align> allocator;
	value_type* A = allocator.allocate(MC * KC);
	value_type* B = allocator.allocate(NC * KC);

	const std::size_t M = m().size1();
	const std::size_t N = m().size2();
	const std::size_t K = e1().size2 ();
	const std::size_t mb = (M+MC-1) / MC;
	const std::size_t nb = (N+NC-1) / NC;
	const std::size_t kb = (K+KC-1) / KC;

	auto storageM = m().raw_storage();
	auto C_ = storageM.values;
	const std::size_t ldc = storageM.leading_dimension;
	for (std::size_t j=0; j<nb; ++j) {
		std::size_t nc = std::min(NC, N - j*NC);

		for (std::size_t l=0; l<kb; ++l) {
			std::size_t kc = std::min(KC, K - l*KC);
			auto Bs = subrange(e2, l*KC, l*KC+kc, j*NC, j*NC+nc);
			pack_B_dense(Bs, B, block_size());

			for (std::size_t i=0; i<mb; ++i) {
				std::size_t mc = std::min(MC, M - i*MC);
				auto As = subrange(e1, i*MC, i*MC+mc, l*KC, l*KC+kc);
				pack_A_dense(As, A, block_size());

				mgemm(
					mc, nc, kc, alpha, A, B,
					&C_[i*MC*ldc+j*NC], ldc , 1, block_size()
				);
			}
		}
	}
	//free storage
	allocator.deallocate(A,MC * KC);
	allocator.deallocate(B,NC * KC);
}